

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaBalAig.c
# Opt level: O2

void Gia_ManSuperCollect(Gia_Man_t *p,Gia_Obj_t *pObj,int fStrict)

{
  int iVar1;
  Vec_Int_t *pVVar2;
  Gia_Obj_t *pGVar3;
  
  if (p->vSuper == (Vec_Int_t *)0x0) {
    pVVar2 = Vec_IntAlloc(1000);
    p->vSuper = pVVar2;
  }
  else {
    p->vSuper->nSize = 0;
  }
  iVar1 = Gia_ObjIsXor(pObj);
  if (iVar1 == 0) {
    iVar1 = Gia_ObjIsAndReal(p,pObj);
    if (iVar1 == 0) {
      __assert_fail("0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaBalAig.c"
                    ,0xbb,"void Gia_ManSuperCollect(Gia_Man_t *, Gia_Obj_t *, int)");
    }
    Gia_ManSuperCollectAnd_rec
              (p,(Gia_Obj_t *)
                 ((ulong)((uint)*(undefined8 *)pObj >> 0x1d & 1) ^
                 (ulong)(pObj + -(ulong)((uint)*(undefined8 *)pObj & 0x1fffffff))),fStrict);
    pGVar3 = Gia_ObjChild1(pObj);
    Gia_ManSuperCollectAnd_rec(p,pGVar3,fStrict);
    Vec_IntSort(p->vSuper,(int)pGVar3);
    Gia_ManSimplifyAnd(p->vSuper);
  }
  else {
    if ((*(ulong *)pObj & 0x2000000020000000) != 0) {
      __assert_fail("!Gia_ObjFaninC0(pObj) && !Gia_ObjFaninC1(pObj)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaBalAig.c"
                    ,0xa8,"void Gia_ManSuperCollect(Gia_Man_t *, Gia_Obj_t *, int)");
    }
    Gia_ManSuperCollectXor_rec(p,pObj + -(*(ulong *)pObj & 0x1fffffff),fStrict);
    pGVar3 = pObj + -((ulong)*(uint *)&pObj->field_0x4 & 0x1fffffff);
    Gia_ManSuperCollectXor_rec(p,pGVar3,fStrict);
    Vec_IntSort(p->vSuper,(int)pGVar3);
    Gia_ManSimplifyXor(p->vSuper);
  }
  if (0 < p->vSuper->nSize) {
    return;
  }
  __assert_fail("Vec_IntSize(p->vSuper) > 0",
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaBalAig.c"
                ,0xbe,"void Gia_ManSuperCollect(Gia_Man_t *, Gia_Obj_t *, int)");
}

Assistant:

void Gia_ManSuperCollect( Gia_Man_t * p, Gia_Obj_t * pObj, int fStrict )
{
//    int nSize;
    if ( p->vSuper == NULL )
        p->vSuper = Vec_IntAlloc( 1000 );
    else
        Vec_IntClear( p->vSuper );
    if ( Gia_ObjIsXor(pObj) )
    {
        assert( !Gia_ObjFaninC0(pObj) && !Gia_ObjFaninC1(pObj) );
        Gia_ManSuperCollectXor_rec( p, Gia_ObjFanin0(pObj), fStrict );
        Gia_ManSuperCollectXor_rec( p, Gia_ObjFanin1(pObj), fStrict );
//        nSize = Vec_IntSize(vSuper);
        Vec_IntSort( p->vSuper, 0 );
        Gia_ManSimplifyXor( p->vSuper );
//        if ( nSize != Vec_IntSize(vSuper) )
//            printf( "X %d->%d  ", nSize, Vec_IntSize(vSuper) );
    }
    else if ( Gia_ObjIsAndReal(p, pObj) )
    {
        Gia_ManSuperCollectAnd_rec( p, Gia_ObjChild0(pObj), fStrict );
        Gia_ManSuperCollectAnd_rec( p, Gia_ObjChild1(pObj), fStrict );
//        nSize = Vec_IntSize(vSuper);
        Vec_IntSort( p->vSuper, 0 );
        Gia_ManSimplifyAnd( p->vSuper );
//        if ( nSize != Vec_IntSize(vSuper) )
//            printf( "A %d->%d  ", nSize, Vec_IntSize(vSuper) );
    }
    else assert( 0 );
//    if ( nSize > 10 )
//        printf( "%d ", nSize );
    assert( Vec_IntSize(p->vSuper) > 0 );
}